

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob.hpp
# Opt level: O3

void __thiscall zmq::blob_t::set(blob_t *this,uchar *data_,size_t size_)

{
  uchar *in_RAX;
  uchar *__dest;
  
  if (this->_owned == true) {
    free(this->_data);
  }
  this->_size = 0;
  __dest = (uchar *)malloc(size_);
  this->_data = __dest;
  if (__dest == (uchar *)0x0) {
    set();
    __dest = in_RAX;
  }
  this->_size = size_;
  this->_owned = true;
  memcpy(__dest,data_,size_);
  return;
}

Assistant:

void set (const unsigned char *const data_, const size_t size_)
    {
        clear ();
        _data = static_cast<unsigned char *> (malloc (size_));
        alloc_assert (_data);
        _size = size_;
        _owned = true;
        memcpy (_data, data_, size_);
    }